

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_read_pcm_frames
                    (ma_wav *pWav,void *pFramesOut,ma_uint64 frameCount,ma_uint64 *pFramesRead)

{
  float *pBufferOut;
  ma_data_source_vtable *pmVar1;
  ma_wav *in_RCX;
  long in_RDX;
  long in_RDI;
  ma_format format;
  ma_uint64 totalFramesRead;
  ma_result result;
  ma_channel *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  ma_dr_wav *pWav_00;
  uint in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  if (in_RCX != (ma_wav *)0x0) {
    (in_RCX->ds).vtable = (ma_data_source_vtable *)0x0;
  }
  if (in_RDX == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = MA_SUCCESS;
    pWav_00 = (ma_dr_wav *)0x0;
    ma_wav_get_data_format
              (in_RCX,(ma_format *)(ulong)in_stack_ffffffffffffffd0,(ma_uint32 *)0x0,
               (ma_uint32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,0x1e1154);
    pBufferOut = (float *)(ulong)in_stack_ffffffffffffffc4;
    switch(pBufferOut) {
    case (float *)0x0:
      return MA_INVALID_OPERATION;
    default:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_wav_read_pcm_frames
                         ((ma_dr_wav *)in_RCX,CONCAT44(local_4,in_stack_ffffffffffffffd0),pWav_00);
      break;
    case (float *)0x2:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_wav_read_pcm_frames_s16
                         (pWav_00,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (ma_int16 *)pBufferOut);
      break;
    case (float *)0x4:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_wav_read_pcm_frames_s32
                         (pWav_00,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (ma_int32 *)pBufferOut);
      break;
    case (float *)0x5:
      pmVar1 = (ma_data_source_vtable *)
               ma_dr_wav_read_pcm_frames_f32
                         (pWav_00,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          pBufferOut);
    }
    if (pmVar1 == (ma_data_source_vtable *)0x0) {
      local_4 = MA_AT_END;
    }
    if (in_RCX != (ma_wav *)0x0) {
      (in_RCX->ds).vtable = pmVar1;
    }
    if ((local_4 == MA_SUCCESS) && (pmVar1 == (ma_data_source_vtable *)0x0)) {
      local_4 = MA_AT_END;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_wav_read_pcm_frames(ma_wav* pWav, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_WAV)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;

        ma_wav_get_data_format(pWav, &format, NULL, NULL, NULL, 0);

        switch (format)
        {
            case ma_format_f32:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_f32(&pWav->dr, frameCount, (float*)pFramesOut);
            } break;

            case ma_format_s16:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_s16(&pWav->dr, frameCount, (ma_int16*)pFramesOut);
            } break;

            case ma_format_s32:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_s32(&pWav->dr, frameCount, (ma_int32*)pFramesOut);
            } break;

            /* Fallback to a raw read. */
            case ma_format_unknown: return MA_INVALID_OPERATION; /* <-- this should never be hit because initialization would just fall back to a supported format. */
            default:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames(&pWav->dr, frameCount, pFramesOut);
            } break;
        }

        /* In the future we'll update ma_dr_wav to return MA_AT_END for us. */
        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}